

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::VarDeclStmt> __thiscall
mocker::Parser::varDeclStmt(Parser *this,TokIter *iter,TokIter end)

{
  Token *pTVar1;
  Position beg;
  Position beg_00;
  Position beg_01;
  Position end_00;
  Position end_01;
  Position end_02;
  undefined4 uVar2;
  TokIter TVar3;
  TokIter TVar4;
  TokIter TVar5;
  TokenID TVar6;
  TokenID TVar7;
  CompileError *pCVar8;
  Token *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  element_type *peVar10;
  bool bVar11;
  shared_ptr<mocker::ast::Type> sVar12;
  shared_ptr<mocker::ast::Identifier> sVar13;
  shared_ptr<mocker::ast::VarDeclStmt> sVar14;
  Position end_03;
  Position end_04;
  Position beg_02;
  Position beg_03;
  Parser local_a0;
  shared_ptr<mocker::ast::Type> *local_88;
  element_type *local_80;
  shared_ptr<mocker::ast::Expression> expr;
  shared_ptr<mocker::ast::Identifier> ident;
  undefined1 local_58 [16];
  shared_ptr<mocker::ast::Type> varType;
  
  local_80 = (element_type *)this;
  Token::position(*end._M_current);
  TVar5._M_current = local_a0.tokEnd._M_current;
  TVar3._M_current = local_a0.tokBeg._M_current;
  TVar7 = (end._M_current)->id;
  uVar2 = *(undefined4 *)&(end._M_current)->field_0x4;
  sVar12 = type(&local_a0,iter,end);
  TVar4._M_current = local_a0.tokBeg._M_current;
  _Var9 = sVar12.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  bVar11 = true;
  if (local_a0.tokBeg._M_current != (Token *)0x0) {
    sVar13 = identifier((Parser *)local_58,iter,end);
    _Var9 = sVar13.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if ((Token *)local_58._0_8_ != (Token *)0x0) {
      pTVar1 = *end._M_current;
      *(Token **)end._M_current = pTVar1 + 1;
      if (pTVar1 == in_RCX) {
        TVar6 = Error;
      }
      else {
        TVar6 = Token::tokenID(pTVar1);
        _Var9._M_pi = extraout_RDX;
      }
      bVar11 = TVar6 == LeftParen;
    }
  }
  if ((TVar4._M_current != (Token *)0x0) && ((Token *)local_58._8_8_ != (Token *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    _Var9._M_pi = extraout_RDX_00;
  }
  if (local_a0.tokEnd._M_current != (Token *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.tokEnd._M_current);
    _Var9._M_pi = extraout_RDX_01;
  }
  (end._M_current)->id = TVar7;
  *(undefined4 *)&(end._M_current)->field_0x4 = uVar2;
  if (bVar11) {
    (local_80->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)0x0;
    (local_80->super_Statement).super_ASTNode.super_enable_shared_from_this<mocker::ast::ASTNode>.
    _M_weak_this.super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    peVar10 = local_80;
  }
  else {
    type((Parser *)&varType,iter,end);
    if (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      __assert_fail("varType",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                    ,0x1bd,
                    "std::shared_ptr<ast::VarDeclStmt> mocker::Parser::varDeclStmt(TokIter &, TokIter)"
                   );
    }
    identifier((Parser *)&ident,iter,end);
    if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      __assert_fail("ident",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                    ,0x1bf,
                    "std::shared_ptr<ast::VarDeclStmt> mocker::Parser::varDeclStmt(TokIter &, TokIter)"
                   );
    }
    if (*end._M_current == in_RCX) {
      TVar7 = Error;
    }
    else {
      TVar7 = Token::tokenID(*end._M_current);
    }
    if (TVar7 == Semicolon) {
      pTVar1 = *end._M_current;
      *(Token **)end._M_current = pTVar1 + 1;
      Token::position(pTVar1);
      peVar10 = local_80;
      expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      end_03.col = (size_t)local_a0.pos;
      end_03.line = (size_t)TVar5._M_current;
      beg_02.col = (size_t)TVar3._M_current;
      beg_02.line = (size_t)iter;
      sVar14 = makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,decltype(nullptr)>
                         ((Parser *)local_80,beg_02,end_03,local_88,
                          (shared_ptr<mocker::ast::Identifier> *)&varType,(void **)&ident);
      _Var9 = sVar14.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      if (*end._M_current == in_RCX) {
        TVar7 = Error;
      }
      else {
        TVar7 = Token::tokenID(*end._M_current);
      }
      if (TVar7 != Assign) {
        pCVar8 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        end_00.col = (size_t)local_88;
        end_00.line = (size_t)local_a0.pos;
        beg.col = (size_t)TVar5._M_current;
        beg.line = (size_t)TVar3._M_current;
        CompileError::CompileError(pCVar8,beg,end_00);
        *(undefined ***)pCVar8 = &PTR__CompileError_001f2a98;
        __cxa_throw(pCVar8,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
      local_a0.tokBeg._M_current = (Token *)logicalOrExpr;
      local_a0.tokEnd._M_current = (Token *)0x0;
      local_a0.pos = (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                      *)iter;
      auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
                ((Parser *)&expr,iter,end,
                 (_Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
                  *)in_RCX,(pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> *)&local_a0);
      if (expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        pCVar8 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        end_01.col = (size_t)local_88;
        end_01.line = (size_t)local_a0.pos;
        beg_00.col = (size_t)TVar5._M_current;
        beg_00.line = (size_t)TVar3._M_current;
        CompileError::CompileError(pCVar8,beg_00,end_01);
        *(undefined ***)pCVar8 = &PTR__CompileError_001f2a98;
        __cxa_throw(pCVar8,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      if (*end._M_current == in_RCX) {
        TVar7 = Error;
      }
      else {
        TVar7 = Token::tokenID(*end._M_current);
      }
      if (TVar7 != Semicolon) {
        pCVar8 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        end_02.col = (size_t)local_88;
        end_02.line = (size_t)local_a0.pos;
        beg_01.col = (size_t)TVar5._M_current;
        beg_01.line = (size_t)TVar3._M_current;
        CompileError::CompileError(pCVar8,beg_01,end_02);
        *(undefined ***)pCVar8 = &PTR__CompileError_001f2a98;
        __cxa_throw(pCVar8,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      pTVar1 = *end._M_current;
      *(Token **)end._M_current = pTVar1 + 1;
      Token::position(pTVar1);
      peVar10 = local_80;
      end_04.col = (size_t)local_a0.pos;
      end_04.line = (size_t)TVar5._M_current;
      beg_03.col = (size_t)TVar3._M_current;
      beg_03.line = (size_t)iter;
      sVar14 = makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,std::shared_ptr<mocker::ast::Expression>&>
                         ((Parser *)local_80,beg_03,end_04,local_88,
                          (shared_ptr<mocker::ast::Identifier> *)&varType,
                          (shared_ptr<mocker::ast::Expression> *)&ident);
      _Var9 = sVar14.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var9._M_pi = extraout_RDX_02;
      }
    }
    if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var9._M_pi = extraout_RDX_03;
    }
    if (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var9._M_pi = extraout_RDX_04;
    }
  }
  sVar14.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var9._M_pi;
  sVar14.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar10;
  return (shared_ptr<mocker::ast::VarDeclStmt>)
         sVar14.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::VarDeclStmt> Parser::varDeclStmt(TokIter &iter,
                                                      TokIter end) {
  auto id = GetTokenID(end);
  auto begPos = iter->position().first;
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  // look ahead
  auto beg = iter;
  if (!type(iter, end) || !identifier(iter, end) ||
      id(iter++) == TokenID::LeftParen) {
    iter = beg;
    return nullptr;
  }
  iter = beg;

  auto varType = type(iter, end);
  assert(varType);
  auto ident = identifier(iter, end);
  assert(ident);
  if (id(iter) == TokenID::Semicolon)
    return makeNode<ast::VarDeclStmt>(begPos, (iter++)->position().second,
                                      varType, ident, nullptr);

  if (id(iter) != TokenID::Assign)
    throwError();
  ++iter;
  auto expr = expression(iter, end);
  if (!expr)
    throwError();
  if (id(iter) != TokenID::Semicolon)
    throwError();
  return makeNode<ast::VarDeclStmt>(begPos, (iter++)->position().second,
                                    varType, ident, expr);
}